

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::PushColumnsBackground(void)

{
  ImGuiOldColumns *pIVar1;
  ImGuiWindow *clip_rect;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  
  clip_rect = GetCurrentWindowRead();
  pIVar1 = (clip_rect->DC).CurrentColumns;
  if (pIVar1->Count != 1) {
    (pIVar1->HostBackupClipRect).Min = (clip_rect->ClipRect).Min;
    (pIVar1->HostBackupClipRect).Max = (clip_rect->ClipRect).Max;
    SetWindowClipRectBeforeSetChannel
              ((ImGuiWindow *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(ImRect *)clip_rect);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)window,(ImDrawList *)columns,unaff_retaddr_00);
  }
  return;
}

Assistant:

void ImGui::PushColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    columns->HostBackupClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, columns->HostInitialClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, 0);
}